

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.h
# Opt level: O0

void gimage::remapImage<unsigned_char>
               (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image,
               Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *map)

{
  bool bVar1;
  byte bVar2;
  store_t v;
  int iVar3;
  long lVar4;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_RSI;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_RDI;
  int d;
  long i;
  long k;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_stack_ffffffffffffffa8;
  long in_stack_ffffffffffffffb0;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_stack_ffffffffffffffb8;
  int local_24;
  long local_20;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *local_18;
  
  for (local_18 = (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)0x0;
      lVar4 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(in_RDI),
      (long)local_18 < lVar4;
      local_18 = (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                 ((long)&local_18->depth + 1)) {
    for (local_20 = 0;
        lVar4 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth(in_RDI),
        local_20 < lVar4; local_20 = local_20 + 1) {
      bVar1 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::isValid
                        (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                         (long)in_stack_ffffffffffffffa8);
      if (bVar1) {
        for (local_24 = 0;
            iVar3 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getDepth(in_RDI),
            local_24 < iVar3; local_24 = local_24 + 1) {
          in_stack_ffffffffffffffa8 = in_RDI;
          in_stack_ffffffffffffffb0 = local_20;
          in_stack_ffffffffffffffb8 = local_18;
          bVar2 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::get
                            (in_RDI,local_20,(long)local_18,local_24);
          v = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::get
                        (in_RSI,(ulong)bVar2,0,local_24);
          Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::set
                    (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb0,
                     (long)in_stack_ffffffffffffffb8,local_24,v);
        }
      }
    }
  }
  return;
}

Assistant:

void remapImage(Image<T> &image, const Image<T> &map)
{
  assert(map.getWidth() >= image.absMaxValue()+1);
  assert(map.getDepth() == image.getDepth());

  for (long k=0; k<image.getHeight(); k++)
  {
    for (long i=0; i<image.getWidth(); i++)
    {
      if (image.isValid(i, k))
      {
        for (int d=0; d<image.getDepth(); d++)
        {
          image.set(i, k, d, map.get(static_cast<long>(image.get(i, k, d)), 0, d));
        }
      }
    }
  }
}